

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O3

void __thiscall slang::ast::builtins::SizeFunction::SizeFunction(SizeFunction *this)

{
  string_view sVar1;
  
  (this->super_ArrayQueryFunction).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005da020;
  sVar1 = parsing::toString(Size);
  (this->super_ArrayQueryFunction).super_SystemSubroutine.name._M_dataplus._M_p =
       (pointer)&(this->super_ArrayQueryFunction).super_SystemSubroutine.name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->super_ArrayQueryFunction).super_SystemSubroutine.name,sVar1._M_str,
             sVar1._M_str + sVar1._M_len);
  (this->super_ArrayQueryFunction).super_SystemSubroutine.kind = Function;
  (this->super_ArrayQueryFunction).super_SystemSubroutine.knownNameId = Size;
  (this->super_ArrayQueryFunction).super_SystemSubroutine.hasOutputArgs = false;
  (this->super_ArrayQueryFunction).super_SystemSubroutine.neverReturns = false;
  (this->super_ArrayQueryFunction).super_SystemSubroutine.withClauseMode = None;
  (this->super_ArrayQueryFunction).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005d7f18;
  return;
}

Assistant:

ConstantValue LowFunction::eval(EvalContext& context, const Args& args, SourceRange,
                                const CallExpression::SystemCallInfo&) const {
    DimResult dim = getDim(context, args);
    if (dim.hardFail)
        return nullptr;

    if (dim.outOfRange)
        return SVInt::createFillX(32, true);

    if (dim.isDynamic)
        return SVInt(32, 0, true);

    // For associative arrays, $low returns the first key, or 'x if no elements.
    if (dim.indexType) {
        if (dim.map.empty())
            return SVInt::createFillX(dim.indexType->getBitWidth(), dim.indexType->isSigned());
        return dim.map.begin()->first;
    }

    return SVInt(32, uint64_t(dim.range.lower()), true);
}